

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

logic_t slang::condWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint64_t *puVar4;
  SVInt *in_RSI;
  long in_RDI;
  uint64_t mask;
  uint32_t i;
  uint32_t words;
  bool bothSigned;
  SVInt *in_stack_ffffffffffffff80;
  SVInt *in_stack_ffffffffffffff90;
  SVInt *this;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar5;
  SVInt *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffac;
  SVInt local_30;
  undefined7 in_stack_ffffffffffffffe0;
  logic_t local_1;
  
  if (((in_RSI->super_SVIntStorage).unknownFlag & 1U) == 0) {
    local_1 = SVInt::operator==((SVInt *)CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8),
                                in_stack_ffffffffffffffa0);
  }
  else if (*(bitwidth_t *)(in_RDI + 8) == (in_RSI->super_SVIntStorage).bitWidth) {
    uVar2 = SVInt::getNumWords((in_RSI->super_SVIntStorage).bitWidth,false);
    for (uVar6 = 0; uVar6 < uVar2; uVar6 = uVar6 + 1) {
      uVar3 = (in_RSI->super_SVIntStorage).field_0.pVal[uVar6 + uVar2] ^ 0xffffffffffffffff;
      if (((*(byte *)(in_RDI + 0xd) & 1) != 0) &&
         (puVar4 = SVInt::getRawData(in_stack_ffffffffffffff80),
         (puVar4[uVar6 + uVar2] & uVar3) != 0)) {
        return (logic_t)0x80;
      }
      puVar4 = SVInt::getRawData(in_stack_ffffffffffffff80);
      if ((puVar4[uVar6] & uVar3) != ((in_RSI->super_SVIntStorage).field_0.pVal[uVar6] & uVar3)) {
        logic_t::logic_t(&local_1,'\0');
        return (logic_t)local_1.value;
      }
    }
    logic_t::logic_t(&local_1,'\x01');
  }
  else {
    bVar5 = 0;
    if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
      bVar5 = (in_RSI->super_SVIntStorage).signFlag;
    }
    bVar1 = bVar5 & 1;
    if (*(uint *)(in_RDI + 8) < (in_RSI->super_SVIntStorage).bitWidth) {
      this = &local_30;
      SVInt::extend((SVInt *)CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff9e,
                                                     in_stack_ffffffffffffff98)),
                    (bitwidth_t)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
      local_1 = condWildcardEqual(in_RSI,(SVInt *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
      SVInt::~SVInt(this);
    }
    else {
      SVInt::extend((SVInt *)CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff9e,
                                                     in_stack_ffffffffffffff98)),
                    (bitwidth_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                    SUB81((ulong)in_stack_ffffffffffffff90 >> 0x18,0));
      local_1 = condWildcardEqual(in_RSI,(SVInt *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
      SVInt::~SVInt(in_stack_ffffffffffffff90);
    }
  }
  return (logic_t)local_1.value;
}

Assistant:

logic_t condWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!rhs.unknownFlag)
        return lhs == rhs;

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return condWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return condWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the bits unknown on the rhs
        uint64_t mask = ~rhs.pVal[i + words];
        if (lhs.unknownFlag && (lhs.getRawData()[i + words] & mask) != 0)
            return logic_t::x;

        if ((lhs.getRawData()[i] & mask) != (rhs.pVal[i] & mask))
            return logic_t(false);
    }

    return logic_t(true);
}